

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O2

Hop_Obj_t * Hop_CreateOr(Hop_Man_t *p,int nVars)

{
  Hop_Obj_t *p1;
  int i;
  Hop_Obj_t *p0;
  
  p0 = (Hop_Obj_t *)((ulong)p->pConst1 ^ 1);
  i = 0;
  if (nVars < 1) {
    nVars = i;
  }
  for (; nVars != i; i = i + 1) {
    p1 = Hop_IthVar(p,i);
    p0 = Hop_Or(p,p0,p1);
  }
  return p0;
}

Assistant:

Hop_Obj_t * Hop_CreateOr( Hop_Man_t * p, int nVars )
{
    Hop_Obj_t * pFunc;
    int i;
    pFunc = Hop_ManConst0( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Hop_Or( p, pFunc, Hop_IthVar(p, i) );
    return pFunc;
}